

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O0

iterator __thiscall
spvtools::opt::InlinePass::AddStoresForVariableInitializers
          (InlinePass *this,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *callee2caller,DebugInlinedAtContext *inlined_at_ctx,
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          *new_blk_ptr,UptrVectorIterator<spvtools::opt::BasicBlock,_false> callee_first_block_itr)

{
  UptrVector *block_ptr;
  DebugInlinedAtContext *pDVar1;
  Op OVar2;
  CommonDebugInfoInstructions CVar3;
  uint32_t uVar4;
  uint32_t val_id_00;
  Instruction *pIVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  IRContext *pIVar8;
  DebugInfoManager *pDVar9;
  Instruction *pIVar10;
  DebugScope *pDVar11;
  pointer new_blk_ptr_00;
  bool bVar12;
  DebugScope local_48;
  uint32_t local_40;
  uint32_t local_3c;
  uint32_t val_id;
  uint32_t local_34;
  uint32_t new_var_id;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
  *new_blk_ptr_local;
  DebugInlinedAtContext *inlined_at_ctx_local;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *callee2caller_local;
  InlinePass *this_local;
  iterator *callee_itr;
  
  _new_var_id = callee_first_block_itr.container_;
  new_blk_ptr_local = new_blk_ptr;
  inlined_at_ctx_local = inlined_at_ctx;
  callee2caller_local = callee2caller;
  this_local = this;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
            ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&stack0x00000008);
  BasicBlock::begin((BasicBlock *)this);
  while( true ) {
    pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator->
                       ((iterator_template<spvtools::opt::Instruction> *)this);
    OVar2 = opt::Instruction::opcode(pIVar5);
    bVar12 = true;
    if (OVar2 != OpVariable) {
      pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)this);
      CVar3 = opt::Instruction::GetCommonDebugOpcode(pIVar5);
      bVar12 = CVar3 == CommonDebugInfoDebugDeclare;
    }
    if (!bVar12) break;
    pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator->
                       ((iterator_template<spvtools::opt::Instruction> *)this);
    OVar2 = opt::Instruction::opcode(pIVar5);
    if (OVar2 == OpVariable) {
      pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)this);
      uVar4 = opt::Instruction::NumInOperands(pIVar5);
      pDVar1 = inlined_at_ctx_local;
      if (uVar4 == 2) {
        pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator->
                           ((iterator_template<spvtools::opt::Instruction> *)this);
        local_34 = opt::Instruction::result_id(pIVar5);
        sVar6 = std::
                unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                ::count((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                         *)pDVar1,&local_34);
        pDVar1 = inlined_at_ctx_local;
        if (sVar6 == 0) {
          __assert_fail("callee2caller.count(callee_itr->result_id()) && \"Expected the variable to have already been mapped.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/inline_pass.cpp"
                        ,0x144,
                        "InstructionList::iterator spvtools::opt::InlinePass::AddStoresForVariableInitializers(const std::unordered_map<uint32_t, uint32_t> &, analysis::DebugInlinedAtContext *, std::unique_ptr<BasicBlock> *, UptrVectorIterator<BasicBlock>)"
                       );
        }
        pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator->
                           ((iterator_template<spvtools::opt::Instruction> *)this);
        local_3c = opt::Instruction::result_id(pIVar5);
        pmVar7 = std::
                 unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::at((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                       *)pDVar1,&local_3c);
        val_id = *pmVar7;
        pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator->
                           ((iterator_template<spvtools::opt::Instruction> *)this);
        val_id_00 = opt::Instruction::GetSingleWordInOperand(pIVar5,1);
        block_ptr = _new_var_id;
        uVar4 = val_id;
        local_40 = val_id_00;
        pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator->
                           ((iterator_template<spvtools::opt::Instruction> *)this);
        pIVar5 = opt::Instruction::dbg_line_inst(pIVar5);
        pIVar8 = Pass::context((Pass *)callee2caller);
        pDVar9 = IRContext::get_debug_info_mgr(pIVar8);
        pIVar10 = utils::IntrusiveList<spvtools::opt::Instruction>::
                  iterator_template<spvtools::opt::Instruction>::operator->
                            ((iterator_template<spvtools::opt::Instruction> *)this);
        pDVar11 = opt::Instruction::GetDebugScope(pIVar10);
        local_48 = analysis::DebugInfoManager::BuildDebugScope
                             (pDVar9,pDVar11,(DebugInlinedAtContext *)new_blk_ptr_local);
        AddStore((InlinePass *)callee2caller,uVar4,val_id_00,
                 (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                  *)block_ptr,pIVar5,&local_48);
      }
    }
    pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator->
                       ((iterator_template<spvtools::opt::Instruction> *)this);
    CVar3 = opt::Instruction::GetCommonDebugOpcode(pIVar5);
    pDVar1 = inlined_at_ctx_local;
    if (CVar3 == CommonDebugInfoDebugDeclare) {
      new_blk_ptr_00 =
           std::
           unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
           get((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                *)_new_var_id);
      pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*
                         ((iterator_template<spvtools::opt::Instruction> *)this);
      pIVar8 = Pass::context((Pass *)callee2caller);
      pDVar9 = IRContext::get_debug_info_mgr(pIVar8);
      pIVar10 = utils::IntrusiveList<spvtools::opt::Instruction>::
                iterator_template<spvtools::opt::Instruction>::operator->
                          ((iterator_template<spvtools::opt::Instruction> *)this);
      pDVar11 = opt::Instruction::GetDebugScope(pIVar10);
      uVar4 = DebugScope::GetInlinedAt(pDVar11);
      uVar4 = analysis::DebugInfoManager::BuildDebugInlinedAtChain
                        (pDVar9,uVar4,(DebugInlinedAtContext *)new_blk_ptr_local);
      InlineSingleInstruction
                ((InlinePass *)callee2caller,
                 (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  *)pDVar1,new_blk_ptr_00,pIVar5,uVar4);
    }
    InstructionList::iterator::operator++((iterator *)this);
  }
  return (iterator)(iterator)this;
}

Assistant:

InstructionList::iterator InlinePass::AddStoresForVariableInitializers(
    const std::unordered_map<uint32_t, uint32_t>& callee2caller,
    analysis::DebugInlinedAtContext* inlined_at_ctx,
    std::unique_ptr<BasicBlock>* new_blk_ptr,
    UptrVectorIterator<BasicBlock> callee_first_block_itr) {
  auto callee_itr = callee_first_block_itr->begin();
  while (callee_itr->opcode() == spv::Op::OpVariable ||
         callee_itr->GetCommonDebugOpcode() == CommonDebugInfoDebugDeclare) {
    if (callee_itr->opcode() == spv::Op::OpVariable &&
        callee_itr->NumInOperands() == 2) {
      assert(callee2caller.count(callee_itr->result_id()) &&
             "Expected the variable to have already been mapped.");
      uint32_t new_var_id = callee2caller.at(callee_itr->result_id());

      // The initializer must be a constant or global value.  No mapped
      // should be used.
      uint32_t val_id = callee_itr->GetSingleWordInOperand(1);
      AddStore(new_var_id, val_id, new_blk_ptr, callee_itr->dbg_line_inst(),
               context()->get_debug_info_mgr()->BuildDebugScope(
                   callee_itr->GetDebugScope(), inlined_at_ctx));
    }
    if (callee_itr->GetCommonDebugOpcode() == CommonDebugInfoDebugDeclare) {
      InlineSingleInstruction(
          callee2caller, new_blk_ptr->get(), &*callee_itr,
          context()->get_debug_info_mgr()->BuildDebugInlinedAtChain(
              callee_itr->GetDebugScope().GetInlinedAt(), inlined_at_ctx));
    }
    ++callee_itr;
  }
  return callee_itr;
}